

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::InnerProduct3D_1D::backward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> tdEdf;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_d0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_b8;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_a8;
  undefined1 local_88 [40];
  long local_60;
  long lStack_58;
  long local_50;
  long lStack_48;
  long local_40;
  long lStack_38;
  
  Tensor::t<2>(&local_d0,dEdf);
  if (i == 2) {
    Tensor::t<2>((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)local_88,
                 dEdxi);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    operator+=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1> *
               )local_88,&local_d0);
  }
  else if (i == 1) {
    Tensor::t<3>(&local_a8,
                 *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start);
    local_88._16_8_ = local_d0.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88._0_8_ = local_d0.m_data;
    local_88._8_8_ = local_d0.m_dimensions.super_array<long,_2>._M_elems[0];
    local_60 = local_a8.m_dimensions.super_array<long,_3>._M_elems[1];
    lStack_58 = local_a8.m_dimensions.super_array<long,_3>._M_elems[2];
    local_50 = 0;
    lStack_48 = 0;
    local_40 = 1;
    lStack_38 = 1;
    local_b8 = Tensor::t<1>(dEdxi);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator+=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1> *
               )&local_b8,
               (TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
                *)local_88);
  }
  else {
    if (i != 0) {
      std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
      abort();
    }
    local_88._24_16_ =
         (undefined1  [16])
         Tensor::t<1>((xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[1]);
    local_88._16_8_ = local_d0.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88._0_8_ = local_d0.m_data;
    local_88._8_8_ = local_d0.m_dimensions.super_array<long,_2>._M_elems[0];
    Tensor::t<3>(&local_a8,dEdxi);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>::
    operator+=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1> *
               )&local_a8,
               (TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
                *)local_88);
  }
  return;
}

Assistant:

void InnerProduct3D_1D::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  auto tdEdf = dEdf.t<2>();  // 2 tensor
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  if (i == 0) { // 3 tensor
    // tensor product
    auto b = xs[1]->t<1>();
    dEdxi.t<3>() += tdEdf.contract(b, Eigen::array<DimPair, 0>{{}});
  } else if (i == 1) {
    auto A = xs[0]->t<3>();  // A is 3 tensor
    Eigen::array<DimPair, 2> dims({{DimPair(0, 0), DimPair(1, 1)}});
    dEdxi.t<1>() += tdEdf.contract(A, dims);
  } else if (i == 2) {
    dEdxi.t<2>() += tdEdf;
  } else {
    cerr << "shouldn't happen\n"; abort();
  }
}